

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int band(lua_State *L)

{
  UB UVar1;
  int iVar2;
  UB UVar3;
  lua_State *in_RDI;
  UB b;
  int i;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  UVar1 = barg((lua_State *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffec);
  for (iVar2 = lua_gettop(in_RDI); 1 < iVar2; iVar2 = iVar2 + -1) {
    UVar3 = barg((lua_State *)CONCAT44(iVar2,UVar1),in_stack_ffffffffffffffec);
    UVar1 = UVar3 & UVar1;
  }
  lua_pushnumber(in_RDI,(double)(int)UVar1);
  return 1;
}

Assistant:

static int band(lua_State*L){
int i;UB b=barg(L,1);for(i=lua_gettop(L);i>1;i--)b&=barg(L,i);BRET(b)}